

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O0

int isotree_serialize_to_file(void *isotree_model,FILE *output)

{
  ostream *poVar1;
  long in_RSI;
  long in_RDI;
  exception *e;
  IsolationForest *model;
  FILE *in_stack_ffffffffffffffc8;
  IsolationForest *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_RDI == 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Passed NULL \'isotree_model\' to \'isotree_serialize_to_file\'.");
    std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else if (in_RSI == 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Passed invalid file handle to \'isotree_serialize_to_file\'.");
    std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else {
    isotree::IsolationForest::serialize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

ISOTREE_EXPORTED
int isotree_serialize_to_file(const void *isotree_model, FILE *output)
{
    if (!isotree_model) {
        cerr << "Passed NULL 'isotree_model' to 'isotree_serialize_to_file'." << std::endl;
        return IsoTreeError;
    }
    if (!output) {
        cerr << "Passed invalid file handle to 'isotree_serialize_to_file'." << std::endl;
        return IsoTreeError;
    }

    const IsolationForest *model = (const IsolationForest*)isotree_model;
    
    try
    {
        model->serialize(output);
        return IsoTreeSuccess;
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
    }

    return IsoTreeError;
}